

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderBase<Diligent::EngineVkImplTraits>::~ShaderBase
          (ShaderBase<Diligent::EngineVkImplTraits> *this)

{
  code *pcVar1;
  ShaderBase<Diligent::EngineVkImplTraits> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~ShaderBase()
    {
        VERIFY(!GetCompileTask(), "Compile task is still running. This may result in a crash if the task accesses resources owned by the shader object.");
    }